

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O2

int katherine_device_init(katherine_device_t *device,char *addr)

{
  int iVar1;
  
  iVar1 = katherine_udp_init(&device->control_socket,0x613,addr,0x613,100);
  if (iVar1 == 0) {
    iVar1 = katherine_udp_init(&device->data_socket,0x614,addr,0x613,100);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      katherine_udp_fini(&device->control_socket);
    }
  }
  return iVar1;
}

Assistant:

int
katherine_device_init(katherine_device_t *device, const char *addr)
{
    int res;

    if ((res = katherine_udp_init(&device->control_socket, CONTROL_PORT, addr, REMOTE_PORT, CONTROL_TIMEOUT)) != 0) {
        goto err_control;
    }

    if ((res = katherine_udp_init(&device->data_socket, DATA_PORT, addr, REMOTE_PORT, DATA_TIMEOUT)) != 0) {
        goto err_data;
    }

    return 0;

err_data:
    katherine_udp_fini(&device->control_socket);
err_control:
    return res;
}